

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spake25519.cc
# Opt level: O2

void update_with_length_prefix(SHA512_CTX *sha,uint8_t *data,size_t len)

{
  long lVar1;
  size_t sVar2;
  uint8_t len_le [8];
  
  sVar2 = len;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    len_le[lVar1] = (uint8_t)sVar2;
    sVar2 = sVar2 >> 8;
  }
  SHA512_Update((SHA512_CTX *)sha,len_le,8);
  SHA512_Update((SHA512_CTX *)sha,data,len);
  return;
}

Assistant:

static void update_with_length_prefix(SHA512_CTX *sha, const uint8_t *data,
                                      const size_t len) {
  uint8_t len_le[8];
  size_t l = len;
  unsigned i;

  for (i = 0; i < 8; i++) {
    len_le[i] = l & 0xff;
    l >>= 8;
  }

  SHA512_Update(sha, len_le, sizeof(len_le));
  SHA512_Update(sha, data, len);
}